

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

TIntermNode * __thiscall
glslang::TParseContext::executeInitializer
          (TParseContext *this,TSourceLoc *loc,TIntermTyped *initializer,TVariable *variable)

{
  EShSource EVar1;
  TSymbolTable *pTVar2;
  TIntermediate *pTVar3;
  TString name;
  TString name_00;
  TString structName;
  TString structName_00;
  char cVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar10;
  TType *type;
  undefined4 extraout_var_04;
  TIntermTyped *pTVar11;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  TSmallArrayVector *pTVar12;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  TSmallArrayVector *this_00;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  allocator_type aVar13;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  _func_int **pp_Var14;
  TQualifier *this_01;
  undefined4 extraout_var_38;
  TIntermSymbol *left;
  TIntermTyped *pTVar15;
  undefined4 extraout_var_39;
  char *pcVar16;
  char *pcVar17;
  int d;
  uint uVar18;
  TSourceLoc *pTVar19;
  uint uVar20;
  undefined4 in_stack_fffffffffffffe14;
  undefined4 uVar21;
  TVariable *pTVar22;
  allocator_type in_stack_fffffffffffffe20;
  pointer in_stack_fffffffffffffe28;
  pointer pcVar23;
  undefined1 in_stack_fffffffffffffe30 [24];
  TPoolAllocator *local_1b8;
  undefined1 *local_1b0;
  undefined1 local_1a0 [16];
  TPoolAllocator *local_190;
  undefined1 *local_188;
  undefined1 local_178 [16];
  TPoolAllocator *local_168;
  undefined1 *local_160;
  undefined1 local_150 [16];
  TString local_140;
  TString local_118;
  TString local_f0;
  TType local_c8;
  undefined4 extraout_var_03;
  undefined4 extraout_var_37;
  
  iVar6 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[6])(initializer);
  if ((CONCAT44(extraout_var,iVar6) == 0) ||
     (iVar6 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[6])(initializer),
     *(int *)(CONCAT44(extraout_var_00,iVar6) + 0xb8) != 0)) {
    bVar5 = false;
  }
  else {
    iVar6 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[6])(initializer);
    lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar6) + 400))
                       ((long *)CONCAT44(extraout_var_01,iVar6));
    bVar5 = *(long *)(lVar10 + 0x10) == *(long *)(lVar10 + 8);
  }
  iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
  lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar6) + 0x58))
                     ((long *)CONCAT44(extraout_var_02,iVar6));
  uVar18 = *(uint *)(lVar10 + 8) & 0x7f;
  if (2 < uVar18) {
    if (uVar18 == 7) {
      if (bVar5) {
        TParseVersions::profileRequires
                  ((TParseVersions *)this,loc,8,0,"GL_EXT_null_initializer",
                   "initialization with shared qualifier");
        TParseVersions::profileRequires
                  ((TParseVersions *)this,loc,-9,0,"GL_EXT_null_initializer",
                   "initialization with shared qualifier");
      }
      else {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"initializer can only be a null initializer (\'{}\')","shared");
      }
    }
    else if (((uVar18 != 5) ||
             ((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile)) ||
            ((this->super_TParseContextBase).super_TParseVersions.version < 0x78)) {
      iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
      pcVar16 = TType::getStorageQualifierString((TType *)CONCAT44(extraout_var_21,iVar6));
      pp_Var14 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar17 = " cannot initialize this type of qualifier ";
      goto LAB_004bf290;
    }
  }
  iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
  type = (TType *)CONCAT44(extraout_var_03,iVar6);
  if (bVar5) {
    iVar6 = (*type->_vptr_TType[0x35])(type);
    if ((char)iVar6 == '\0') {
      iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
      cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_22,iVar6) + 0x1b0))
                        ((long *)CONCAT44(extraout_var_22,iVar6));
      if (cVar4 == '\0') {
        iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])(variable);
        lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_24,iVar6) + 0x50))
                           ((long *)CONCAT44(extraout_var_24,iVar6));
        *(byte *)(lVar10 + 0xf) = *(byte *)(lVar10 + 0xf) | 4;
        return (TIntermNode *)0x0;
      }
      pp_Var14 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar17 = "null initializers can\'t be used on opaque values";
    }
    else {
      pp_Var14 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar17 = "null initializers can\'t size unsized arrays";
    }
    pcVar16 = "{}";
LAB_004bf290:
    (*pp_Var14[0x2d])(this,loc,pcVar17,pcVar16,"");
    return (TIntermNode *)0x0;
  }
  arrayObjectCheck(this,loc,type,"array initializer");
  TType::TType(&local_c8,EbtVoid,EvqTemporary,1,0,0,false);
  iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
  TType::shallowCopy(&local_c8,(TType *)CONCAT44(extraout_var_04,iVar6));
  local_c8.qualifier.semanticName = (char *)0x0;
  local_c8.qualifier._16_1_ = local_c8.qualifier._16_1_ & 0xf0;
  local_c8.qualifier.layoutOffset = -1;
  local_c8.qualifier.layoutAlign = -1;
  local_c8.qualifier.layoutPushConstant = false;
  local_c8.qualifier.layoutBufferReference = false;
  local_c8.qualifier.layoutPassthrough = false;
  local_c8.qualifier.layoutViewportRelative = false;
  local_c8.qualifier.layoutSecondaryViewportRelativeOffset = -0x800;
  local_c8.qualifier.layoutBindlessSampler = false;
  local_c8.qualifier.layoutBindlessImage = false;
  local_c8.qualifier.layoutShaderRecord = false;
  local_c8.qualifier.layoutFullQuads = false;
  local_c8.qualifier.layoutQuadDeriv = false;
  local_c8.qualifier.layoutHitObjectShaderRecordNV = false;
  local_c8.qualifier.spirvStorageClass = -1;
  local_c8.qualifier._44_1_ = 0;
  local_c8.qualifier._28_8_ = local_c8.qualifier._28_8_ & 0xffffffdf8000 | 0xffffffff001fcfff;
  local_c8.qualifier._36_8_ = local_c8.qualifier._36_8_ | 0x1ffffff7fffffff;
  local_c8.qualifier.spirvDecorate = (TSpirvDecorate *)0x0;
  local_c8.qualifier._8_8_ = local_c8.qualifier._8_8_ & 0x141fff0000;
  pTVar11 = convertInitializerList(this,loc,&local_c8,initializer);
  if (pTVar11 == (TIntermTyped *)0x0) {
    if (uVar18 != 2) {
      return (TIntermNode *)0x0;
    }
    iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])();
    this_01 = (TQualifier *)
              (**(code **)(*(long *)CONCAT44(extraout_var_23,iVar6) + 0x50))
                        ((long *)CONCAT44(extraout_var_23,iVar6));
    goto LAB_004bf6de;
  }
  iVar6 = (*(pTVar11->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar11);
  cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar6) + 0xf0))
                    ((long *)CONCAT44(extraout_var_05,iVar6));
  uVar20 = uVar18;
  pTVar22 = variable;
  if (cVar4 != '\0') {
    iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
    cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar6) + 0xf8))
                      ((long *)CONCAT44(extraout_var_06,iVar6));
    if (cVar4 != '\0') {
      iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])(variable);
      iVar7 = (*(pTVar11->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar11);
      uVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar7) + 0x78))
                        ((long *)CONCAT44(extraout_var_08,iVar7));
      pTVar12 = *(TSmallArrayVector **)(CONCAT44(extraout_var_07,iVar6) + 0x60);
      TSmallArrayVector::changeFront(pTVar12,uVar8);
      *(undefined1 *)((long)&pTVar12[1]._vptr_TSmallArrayVector + 4) = 0;
    }
  }
  iVar6 = (*(pTVar11->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar11);
  lVar10 = *(long *)(CONCAT44(extraout_var_09,iVar6) + 0x60);
  if (((lVar10 != 0) && (lVar10 = *(long *)(lVar10 + 8), lVar10 != 0)) &&
     (1 < (int)((ulong)(*(long *)(lVar10 + 0x10) - *(long *)(lVar10 + 8)) >> 4))) {
    iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
    lVar10 = *(long *)(CONCAT44(extraout_var_10,iVar6) + 0x60);
    if (((lVar10 != 0) && (lVar10 = *(long *)(lVar10 + 8), lVar10 != 0)) &&
       (1 < (int)((ulong)(*(long *)(lVar10 + 0x10) - *(long *)(lVar10 + 8)) >> 4))) {
      iVar6 = (*(pTVar11->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar11);
      lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar6) + 0x98))
                         ((long *)CONCAT44(extraout_var_11,iVar6));
      lVar10 = *(long *)(lVar10 + 8);
      iVar7 = 0;
      iVar6 = 0;
      if (lVar10 != 0) {
        iVar6 = (int)((ulong)(*(long *)(lVar10 + 0x10) - *(long *)(lVar10 + 8)) >> 4);
      }
      iVar9 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
      lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar9) + 0x98))
                         ((long *)CONCAT44(extraout_var_12,iVar9));
      lVar10 = *(long *)(lVar10 + 8);
      if (lVar10 != 0) {
        iVar7 = (int)((ulong)(*(long *)(lVar10 + 0x10) - *(long *)(lVar10 + 8)) >> 4);
      }
      if (iVar6 == iVar7) {
        iVar6 = 1;
        while( true ) {
          iVar7 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
          lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar7) + 0x98))
                             ((long *)CONCAT44(extraout_var_13,iVar7));
          lVar10 = *(long *)(lVar10 + 8);
          if (lVar10 == 0) {
            iVar7 = 0;
          }
          else {
            iVar7 = (int)((ulong)(*(long *)(lVar10 + 0x10) - *(long *)(lVar10 + 8)) >> 4);
          }
          if (iVar7 <= iVar6) break;
          iVar7 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
          pTVar12 = (TSmallArrayVector *)
                    (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar7) + 0x98))
                              ((long *)CONCAT44(extraout_var_14,iVar7));
          uVar8 = TSmallArrayVector::getDimSize(pTVar12,iVar6);
          if (uVar8 == 0) {
            iVar7 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])(variable);
            pTVar12 = (TSmallArrayVector *)
                      (**(code **)(*(long *)CONCAT44(extraout_var_15,iVar7) + 0xa0))
                                ((long *)CONCAT44(extraout_var_15,iVar7));
            iVar7 = (*(pTVar11->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar11);
            this_00 = (TSmallArrayVector *)
                      (**(code **)(*(long *)CONCAT44(extraout_var_16,iVar7) + 0x98))
                                ((long *)CONCAT44(extraout_var_16,iVar7));
            uVar8 = TSmallArrayVector::getDimSize(this_00,iVar6);
            TSmallArrayVector::setDimSize(pTVar12,iVar6,uVar8);
          }
          iVar6 = iVar6 + 1;
        }
      }
    }
  }
  if (uVar18 == 5) {
    iVar6 = (*(pTVar11->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar11);
    lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_17,iVar6) + 0x58))
                       ((long *)CONCAT44(extraout_var_17,iVar6));
    if ((*(ulong *)(lVar10 + 8) & 0x10000007f) == 2) goto LAB_004bf11f;
    iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
    pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    EVar1 = pTVar3->source;
    bVar5 = pTVar3->enhancedMsgs;
    local_1b8 = GetThreadPoolAllocator();
    local_1b0 = local_1a0;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_1b8
               ,"","");
    local_168 = GetThreadPoolAllocator();
    local_160 = local_150;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_168
               ,"","");
    name._M_dataplus._M_p = (pointer)&local_168;
    name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_1b8;
    name._M_string_length = (size_type)loc;
    name.field_2._M_allocated_capacity._0_4_ = uVar20;
    name.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffe14;
    name.field_2._8_8_ = pTVar22;
    structName._M_dataplus._M_p = in_stack_fffffffffffffe28;
    structName._M_dataplus.super_allocator_type.allocator = in_stack_fffffffffffffe20.allocator;
    structName._M_string_length = in_stack_fffffffffffffe30._0_8_;
    structName.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
          )in_stack_fffffffffffffe30._8_16_;
    TType::getCompleteString
              (&local_140,(TType *)CONCAT44(extraout_var_26,iVar6),
               (bool)(EVar1 == EShSourceGlsl & bVar5),true,true,true,name,structName);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"uniform initializers must be constant","=","\'%s\'",
               local_140._M_dataplus._M_p);
LAB_004bf6c9:
    pp_Var14 = (variable->super_TSymbol)._vptr_TSymbol;
  }
  else {
LAB_004bf11f:
    pTVar2 = (this->super_TParseContextBase).symbolTable;
    iVar6 = (int)((ulong)((long)(pTVar2->table).
                                super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pTVar2->table).
                               super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
    pTVar19 = loc;
    if (uVar18 != 2) {
      if (iVar6 < 5) {
        iVar6 = (*(pTVar11->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar11);
        lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_25,iVar6) + 0x58))
                           ((long *)CONCAT44(extraout_var_25,iVar6));
        if ((((*(ulong *)(lVar10 + 8) & 0x10000007f) != 2) &&
            ((*(ulong *)(lVar10 + 8) & 0x100000000) == 0)) &&
           ((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile)) {
          if ((((this->super_TParseContextBase).super_TParseVersions.messages & EShMsgRelaxedErrors)
               == EShMsgDefault) ||
             (iVar6 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8]
                      )(this,"GL_EXT_shader_non_constant_global_initializers"), (char)iVar6 != '\0')
             ) {
            TParseVersions::profileRequires
                      ((TParseVersions *)this,loc,8,0,
                       "GL_EXT_shader_non_constant_global_initializers",
                       "non-constant global initializer (needs GL_EXT_shader_non_constant_global_initializers)"
                      );
          }
          else {
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                      (this,loc,"not allowed in this version",
                       "non-constant global initializer (needs GL_EXT_shader_non_constant_global_initializers)"
                       ,"");
          }
        }
      }
LAB_004bf594:
      if ((uVar18 != 5) && (uVar18 != 2)) {
        iVar6 = (*(pTVar11->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar11);
        cVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_38,iVar6) + 0x1d0))
                          ((long *)CONCAT44(extraout_var_38,iVar6));
        if (cVar4 != '\0') {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,
                     "can\'t use with types containing arrays sized with a specialization constant",
                     "initializer","");
        }
        left = TIntermediate::addSymbol
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,variable
                          ,loc);
        pTVar15 = TIntermediate::addAssign
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                             EOpAssign,&left->super_TIntermTyped,pTVar11,loc);
        if (pTVar15 == (TIntermTyped *)0x0) {
          pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          TIntermTyped::getCompleteString_abi_cxx11_
                    (&local_f0,&left->super_TIntermTyped,
                     (bool)(pTVar3->source == EShSourceGlsl & pTVar3->enhancedMsgs));
          pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          TIntermTyped::getCompleteString_abi_cxx11_
                    (&local_118,pTVar11,
                     (bool)(pTVar3->source == EShSourceGlsl & pTVar3->enhancedMsgs));
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"","=","cannot convert from \'%s\' to \'%s\'",
                     local_118._M_dataplus._M_p,local_f0._M_dataplus._M_p._0_1_);
          return &((TIntermTyped *)0x0)->super_TIntermNode;
        }
        return &pTVar15->super_TIntermNode;
      }
      pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
      pTVar11 = TIntermediate::addConversion
                          (pTVar3,EOpAssign,(TType *)CONCAT44(extraout_var_28,iVar6),pTVar11);
      if (pTVar11 != (TIntermTyped *)0x0) {
        iVar6 = (*(pTVar11->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar11);
        lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_29,iVar6) + 0x58))
                           ((long *)CONCAT44(extraout_var_29,iVar6));
        if ((*(ulong *)(lVar10 + 8) & 0x10000007f) == 2 ||
            (*(ulong *)(lVar10 + 8) & 0x100000000) != 0) {
          iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
          iVar7 = (*(pTVar11->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar11);
          bVar5 = TType::operator==((TType *)CONCAT44(extraout_var_30,iVar6),
                                    (TType *)CONCAT44(extraout_var_31,iVar7));
          if (bVar5) {
            iVar6 = (*(pTVar11->super_TIntermNode)._vptr_TIntermNode[5])(pTVar11);
            if (CONCAT44(extraout_var_32,iVar6) == 0) {
              iVar6 = (*(pTVar11->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar11);
              lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_33,iVar6) + 0x58))
                                 ((long *)CONCAT44(extraout_var_33,iVar6));
              if ((*(ulong *)(lVar10 + 8) & 0x100000000) == 0) {
                __assert_fail("initializer->getAsConstantUnion() || initializer->getType().getQualifier().isSpecConstant()"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                              ,0x21a2,
                              "TIntermNode *glslang::TParseContext::executeInitializer(const TSourceLoc &, TIntermTyped *, TVariable *)"
                             );
              }
            }
            iVar6 = (*(pTVar11->super_TIntermNode)._vptr_TIntermNode[5])(pTVar11);
            if (CONCAT44(extraout_var_34,iVar6) == 0) {
              iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])(variable);
              lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_39,iVar6) + 0x50))
                                 ((long *)CONCAT44(extraout_var_39,iVar6));
              *(ulong *)(lVar10 + 8) = (*(ulong *)(lVar10 + 8) & 0xfffffffeffffff80) + 0x100000002;
              (*(variable->super_TSymbol)._vptr_TSymbol[0x1a])(variable,pTVar11);
            }
            else {
              iVar6 = (*(pTVar11->super_TIntermNode)._vptr_TIntermNode[5])(pTVar11);
              (*(variable->super_TSymbol)._vptr_TSymbol[0x19])
                        (variable,CONCAT44(extraout_var_35,iVar6) + 0xb8);
            }
            return (TIntermNode *)0x0;
          }
        }
      }
      iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
      pcVar16 = TType::getStorageQualifierString((TType *)CONCAT44(extraout_var_36,iVar6));
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar19,"non-matching or non-convertible constant type for const initializer",
                 pcVar16,"");
      goto LAB_004bf6c9;
    }
    if (4 < iVar6) {
LAB_004bf17a:
      iVar6 = (*(pTVar11->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar11);
      lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_19,iVar6) + 0x58))
                         ((long *)CONCAT44(extraout_var_19,iVar6));
      uVar18 = 2;
      if ((*(ulong *)(lVar10 + 8) & 0x100000000) == 0 && (*(ulong *)(lVar10 + 8) & 0x10000007f) != 2
         ) {
        loc = pTVar19;
        TParseVersions::requireProfile((TParseVersions *)this,pTVar19,-9,"non-constant initializer")
        ;
        pTVar19 = loc;
        TParseVersions::profileRequires
                  ((TParseVersions *)this,loc,-9,0x1a4,"GL_ARB_shading_language_420pack",
                   "non-constant initializer");
        iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])(variable);
        lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_20,iVar6) + 0x50))
                           ((long *)CONCAT44(extraout_var_20,iVar6));
        *(ulong *)(lVar10 + 8) = *(ulong *)(lVar10 + 8) & 0xffffffffffffff80 | 0x13;
        uVar18 = 0x13;
      }
      goto LAB_004bf594;
    }
    iVar6 = (*(pTVar11->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar11);
    lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_18,iVar6) + 0x58))
                       ((long *)CONCAT44(extraout_var_18,iVar6));
    if ((*(ulong *)(lVar10 + 8) & 0x100000000) != 0 || (*(ulong *)(lVar10 + 8) & 0x10000007f) == 2)
    goto LAB_004bf17a;
    iVar6 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
    pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    EVar1 = pTVar3->source;
    bVar5 = pTVar3->enhancedMsgs;
    uVar21 = extraout_var_27;
    aVar13.allocator = GetThreadPoolAllocator();
    pcVar23 = &stack0xfffffffffffffe38;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
               &stack0xfffffffffffffe20,"","");
    local_190 = GetThreadPoolAllocator();
    local_188 = local_178;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_190
               ,"","");
    name_00._M_dataplus._M_p = (pointer)&local_190;
    name_00._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&stack0xfffffffffffffe20;
    name_00._M_string_length = (size_type)pTVar19;
    name_00.field_2._M_allocated_capacity._0_4_ = iVar6;
    name_00.field_2._M_allocated_capacity._4_4_ = uVar21;
    name_00.field_2._8_8_ = pTVar22;
    structName_00._M_dataplus._M_p = pcVar23;
    structName_00._M_dataplus.super_allocator_type.allocator = aVar13.allocator;
    structName_00._M_string_length = in_stack_fffffffffffffe30._0_8_;
    structName_00.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
          )in_stack_fffffffffffffe30._8_16_;
    TType::getCompleteString
              (&local_140,(TType *)CONCAT44(uVar21,iVar6),(bool)(EVar1 == EShSourceGlsl & bVar5),
               true,true,true,name_00,structName_00);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"global const initializers must be constant","=","\'%s\'",
               local_140._M_dataplus._M_p);
    pp_Var14 = (variable->super_TSymbol)._vptr_TSymbol;
  }
  iVar6 = (*pp_Var14[0xd])(variable);
  this_01 = (TQualifier *)
            (**(code **)(*(long *)CONCAT44(extraout_var_37,iVar6) + 0x50))
                      ((long *)CONCAT44(extraout_var_37,iVar6));
LAB_004bf6de:
  this_01->semanticName = (char *)0x0;
  *(ulong *)&this_01->field_0x8 = *(ulong *)&this_01->field_0x8 & 0xf80000141fff0000;
  TQualifier::clearLayout(this_01);
  this_01->spirvStorageClass = -1;
  this_01->spirvDecorate = (TSpirvDecorate *)0x0;
  this_01->field_0xf = this_01->field_0xf & 0xe7;
  return (TIntermNode *)0x0;
}

Assistant:

TIntermNode* TParseContext::executeInitializer(const TSourceLoc& loc, TIntermTyped* initializer, TVariable* variable)
{
    // A null initializer is an aggregate that hasn't had an op assigned yet
    // (still EOpNull, no relation to nullInit), and has no children.
    bool nullInit = initializer->getAsAggregate() && initializer->getAsAggregate()->getOp() == EOpNull &&
        initializer->getAsAggregate()->getSequence().size() == 0;

    //
    // Identifier must be of type constant, a global, or a temporary, and
    // starting at version 120, desktop allows uniforms to have initializers.
    //
    TStorageQualifier qualifier = variable->getType().getQualifier().storage;
    if (! (qualifier == EvqTemporary || qualifier == EvqGlobal || qualifier == EvqConst ||
           (qualifier == EvqUniform && !isEsProfile() && version >= 120))) {
        if (qualifier == EvqShared) {
            // GL_EXT_null_initializer allows this for shared, if it's a null initializer
            if (nullInit) {
                const char* feature = "initialization with shared qualifier";
                profileRequires(loc, EEsProfile, 0, E_GL_EXT_null_initializer, feature);
                profileRequires(loc, ~EEsProfile, 0, E_GL_EXT_null_initializer, feature);
            } else {
                error(loc, "initializer can only be a null initializer ('{}')", "shared", "");
            }
        } else {
            error(loc, " cannot initialize this type of qualifier ",
                  variable->getType().getStorageQualifierString(), "");
            return nullptr;
        }
    }

    if (nullInit) {
        // only some types can be null initialized
        if (variable->getType().containsUnsizedArray()) {
            error(loc, "null initializers can't size unsized arrays", "{}", "");
            return nullptr;
        }
        if (variable->getType().containsOpaque()) {
            error(loc, "null initializers can't be used on opaque values", "{}", "");
            return nullptr;
        }
        variable->getWritableType().getQualifier().setNullInit();
        return nullptr;
    }

    arrayObjectCheck(loc, variable->getType(), "array initializer");

    //
    // If the initializer was from braces { ... }, we convert the whole subtree to a
    // constructor-style subtree, allowing the rest of the code to operate
    // identically for both kinds of initializers.
    //
    // Type can't be deduced from the initializer list, so a skeletal type to
    // follow has to be passed in.  Constness and specialization-constness
    // should be deduced bottom up, not dictated by the skeletal type.
    //
    TType skeletalType;
    skeletalType.shallowCopy(variable->getType());
    skeletalType.getQualifier().makeTemporary();
    initializer = convertInitializerList(loc, skeletalType, initializer);
    if (! initializer) {
        // error recovery; don't leave const without constant values
        if (qualifier == EvqConst)
            variable->getWritableType().getQualifier().makeTemporary();
        return nullptr;
    }

    // Fix outer arrayness if variable is unsized, getting size from the initializer
    if (initializer->getType().isSizedArray() && variable->getType().isUnsizedArray())
        variable->getWritableType().changeOuterArraySize(initializer->getType().getOuterArraySize());

    // Inner arrayness can also get set by an initializer
    if (initializer->getType().isArrayOfArrays() && variable->getType().isArrayOfArrays() &&
        initializer->getType().getArraySizes()->getNumDims() ==
           variable->getType().getArraySizes()->getNumDims()) {
        // adopt unsized sizes from the initializer's sizes
        for (int d = 1; d < variable->getType().getArraySizes()->getNumDims(); ++d) {
            if (variable->getType().getArraySizes()->getDimSize(d) == UnsizedArraySize) {
                variable->getWritableType().getArraySizes()->setDimSize(d,
                    initializer->getType().getArraySizes()->getDimSize(d));
            }
        }
    }

    // Uniforms require a compile-time constant initializer
    if (qualifier == EvqUniform && ! initializer->getType().getQualifier().isFrontEndConstant()) {
        error(loc, "uniform initializers must be constant", "=", "'%s'",
              variable->getType().getCompleteString(intermediate.getEnhancedMsgs()).c_str());
        variable->getWritableType().getQualifier().makeTemporary();
        return nullptr;
    }
    // Global consts require a constant initializer (specialization constant is okay)
    if (qualifier == EvqConst && symbolTable.atGlobalLevel() && ! initializer->getType().getQualifier().isConstant()) {
        error(loc, "global const initializers must be constant", "=", "'%s'",
              variable->getType().getCompleteString(intermediate.getEnhancedMsgs()).c_str());
        variable->getWritableType().getQualifier().makeTemporary();
        return nullptr;
    }

    // Const variables require a constant initializer, depending on version
    if (qualifier == EvqConst) {
        if (! initializer->getType().getQualifier().isConstant()) {
            const char* initFeature = "non-constant initializer";
            requireProfile(loc, ~EEsProfile, initFeature);
            profileRequires(loc, ~EEsProfile, 420, E_GL_ARB_shading_language_420pack, initFeature);
            variable->getWritableType().getQualifier().storage = EvqConstReadOnly;
            qualifier = EvqConstReadOnly;
        }
    } else {
        // Non-const global variables in ES need a const initializer.
        //
        // "In declarations of global variables with no storage qualifier or with a const
        // qualifier any initializer must be a constant expression."
        if (symbolTable.atGlobalLevel() && ! initializer->getType().getQualifier().isConstant()) {
            const char* initFeature =
                "non-constant global initializer (needs GL_EXT_shader_non_constant_global_initializers)";
            if (isEsProfile()) {
                if (relaxedErrors() && ! extensionTurnedOn(E_GL_EXT_shader_non_constant_global_initializers))
                    warn(loc, "not allowed in this version", initFeature, "");
                else
                    profileRequires(loc, EEsProfile, 0, E_GL_EXT_shader_non_constant_global_initializers, initFeature);
            }
        }
    }

    if (qualifier == EvqConst || qualifier == EvqUniform) {
        // Compile-time tagging of the variable with its constant value...

        initializer = intermediate.addConversion(EOpAssign, variable->getType(), initializer);
        if (! initializer || ! initializer->getType().getQualifier().isConstant() ||
            variable->getType() != initializer->getType()) {
            error(loc, "non-matching or non-convertible constant type for const initializer",
                  variable->getType().getStorageQualifierString(), "");
            variable->getWritableType().getQualifier().makeTemporary();
            return nullptr;
        }

        // We either have a folded constant in getAsConstantUnion, or we have to use
        // the initializer's subtree in the AST to represent the computation of a
        // specialization constant.
        assert(initializer->getAsConstantUnion() || initializer->getType().getQualifier().isSpecConstant());
        if (initializer->getAsConstantUnion())
            variable->setConstArray(initializer->getAsConstantUnion()->getConstArray());
        else {
            // It's a specialization constant.
            variable->getWritableType().getQualifier().makeSpecConstant();

            // Keep the subtree that computes the specialization constant with the variable.
            // Later, a symbol node will adopt the subtree from the variable.
            variable->setConstSubtree(initializer);
        }
    } else {
        // normal assigning of a value to a variable...
        specializationCheck(loc, initializer->getType(), "initializer");
        TIntermSymbol* intermSymbol = intermediate.addSymbol(*variable, loc);
        TIntermTyped* initNode = intermediate.addAssign(EOpAssign, intermSymbol, initializer, loc);
        if (! initNode)
            assignError(loc, "=", intermSymbol->getCompleteString(intermediate.getEnhancedMsgs()), initializer->getCompleteString(intermediate.getEnhancedMsgs()));

        return initNode;
    }

    return nullptr;
}